

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::FastInstancesIterator::
findNextLeaf(FastInstancesIterator *this)

{
  InstMatcher *this_00;
  uint **ppuVar1;
  void **ppvVar2;
  void **ppvVar3;
  bool bVar4;
  bool separate;
  int iVar5;
  Node *pNVar6;
  NodeAlgorithm *pNVar7;
  uint *puVar8;
  undefined8 *puVar9;
  uint specVar;
  Node *curr;
  Node *local_40;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
      SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                (&this->_subst);
      this->_inLeaf = false;
      local_40 = (Node *)0x0;
      separate = false;
LAB_002c73c4:
      this_00 = &this->_subst;
LAB_002c73d9:
      do {
        pNVar6 = local_40;
        if (local_40 == (Node *)0x0) {
          specVar = 0;
        }
        else {
          puVar8 = (this->_specVarNumbers)._cursor + -1;
          if (separate == false) {
            (this->_specVarNumbers)._cursor = puVar8;
          }
          specVar = *puVar8;
        }
        while (pNVar6 == (Node *)0x0) {
          ppvVar2 = (this->_alternatives)._stack;
          ppvVar3 = (this->_alternatives)._cursor;
          if (ppvVar3 == ppvVar2) {
            return false;
          }
          (this->_alternatives)._cursor = ppvVar3 + -1;
          puVar9 = (undefined8 *)ppvVar3[-1];
          pNVar7 = (this->_nodeTypes)._cursor + -1;
          if (puVar9 != (undefined8 *)0x0) {
            if (*pNVar7 == UNSORTED_LIST) {
              local_40 = (Node *)*puVar9;
              if (puVar9[1] == 0) goto LAB_002c74ad;
              puVar9 = puVar9 + 1;
LAB_002c7490:
              Lib::Stack<void_*>::push(&this->_alternatives,puVar9);
              puVar8 = (this->_specVarNumbers)._cursor + -1;
              separate = true;
            }
            else {
              local_40 = (Node *)*puVar9;
              puVar9 = (undefined8 *)puVar9[1];
              if (puVar9 != (undefined8 *)0x0) goto LAB_002c7490;
LAB_002c74ad:
              (this->_nodeTypes)._cursor = pNVar7;
              puVar8 = (this->_specVarNumbers)._cursor + -1;
              (this->_specVarNumbers)._cursor = puVar8;
              separate = false;
            }
            if (local_40 == (Node *)0x0) {
              return false;
            }
            specVar = *puVar8;
            pNVar6 = local_40;
            break;
          }
          (this->_nodeTypes)._cursor = pNVar7;
          ppuVar1 = &(this->_specVarNumbers)._cursor;
          *ppuVar1 = *ppuVar1 + -1;
          pNVar6 = (Node *)0x0;
          if (ppvVar3 + -1 != ppvVar2) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
            pNVar6 = local_40;
          }
        }
        bVar4 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::
                matchNext(this_00,specVar,(TermList)(pNVar6->_term)._content,separate);
        if (bVar4) {
          do {
            iVar5 = (*local_40->_vptr_Node[2])();
            if ((((char)iVar5 != '\0') || (iVar5 = (*local_40->_vptr_Node[5])(), iVar5 != 1)) ||
               (*(int *)((long)&local_40[1]._vptr_Node + 4) != 1)) {
              iVar5 = (*local_40->_vptr_Node[2])();
              if ((char)iVar5 != '\0') {
                (*local_40->_vptr_Node[8])(&local_38);
                Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::operator=
                          (&this->_ldIterator,&local_38);
                Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>::
                ~VirtualIterator(&local_38);
                this->_inLeaf = true;
                Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::reset(&(this->_subst)._derefBindings);
                return true;
              }
              separate = enterNode(this,&local_40);
              if (local_40 != (Node *)0x0) goto LAB_002c73d9;
              goto LAB_002c7588;
            }
            pNVar6 = local_40 + 1;
            local_40 = (Node *)local_40[1]._term._content;
            bVar4 = SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::
                    matchNext(this_00,*(uint *)&pNVar6->_vptr_Node,
                              (TermList)(local_40->_term)._content,false);
          } while (bVar4);
          if ((separate != false) || ((this->_alternatives)._cursor != (this->_alternatives)._stack)
             ) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
          }
          local_40 = (Node *)0x0;
          goto LAB_002c73d9;
        }
        local_40 = (Node *)0x0;
        if (separate == false) {
LAB_002c7588:
          if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
            SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::backtrack
                      (this_00);
          }
        }
      } while( true );
    }
  }
  else {
    local_40 = this->_root;
    if (local_40 != (Node *)0x0) {
      this->_root = (Node *)0x0;
      separate = enterNode(this,&local_40);
      goto LAB_002c73c4;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastInstancesIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
        ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
        currSpecVar = _specVarNumbers.top();
      } else {
	      currSpecVar = _specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
        //there's no alternative at this level, we have to backtrack
        _nodeTypes.pop();
        _specVarNumbers.pop();
        if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType = _nodeTypes.top();

      //the fact that we have alternatives means that here we are
      //matching by a variable (as there is always at most one child
      //for matching by term)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	curr=*(alts++);
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	ASS(alts);

	curr=alts->head();
	if(alts->tail()) {
	  _alternatives.push(alts->tail());
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      }

      if(sibilingsRemain) {
        currSpecVar = _specVarNumbers.top();
      } else {
        _nodeTypes.pop();
        currSpecVar = _specVarNumbers.pop();
      }
      ASS(curr);
      break;
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
	_subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst.backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      _subst.onLeafEntered(); //we reset the bindings cache
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}